

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandPoolManager.cpp
# Opt level: O1

CommandPoolWrapper * __thiscall
Diligent::CommandPoolManager::AllocateCommandPool
          (CommandPoolWrapper *__return_storage_ptr__,CommandPoolManager *this,char *DebugName)

{
  VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> *rhs;
  int iVar1;
  string msg;
  VkCommandPoolCreateInfo CmdPoolCI;
  undefined1 local_68 [32];
  VkCommandPoolCreateInfo local_48;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_Mutex);
  if (iVar1 == 0) {
    (__return_storage_ptr__->m_pLogicalDevice).
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->m_pLogicalDevice).
    super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    __return_storage_ptr__->m_VkObject = (VkCommandPool_T *)0x0;
    rhs = (this->m_CmdPools).
          super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->m_CmdPools).
        super__Deque_base<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur != rhs) {
      VulkanUtilities::
      VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::operator=
                (__return_storage_ptr__,rhs);
      std::
      deque<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::STDAllocator<VulkanUtilities::VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>,_Diligent::IMemoryAllocator>_>
      ::pop_front(&this->m_CmdPools);
      VulkanUtilities::VulkanLogicalDevice::ResetCommandPool
                (this->m_LogicalDevice,__return_storage_ptr__->m_VkObject,0);
    }
    if (__return_storage_ptr__->m_VkObject == (VkCommandPool_T *)0x0) {
      local_48.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
      local_48._4_4_ = 0;
      local_48.pNext = (void *)0x0;
      local_48.queueFamilyIndex._0_1_ = (this->m_QueueFamilyIndex).m_Value;
      local_48.flags = this->m_CmdPoolFlags;
      local_48.queueFamilyIndex._1_3_ = 0;
      VulkanUtilities::VulkanLogicalDevice::CreateCommandPool
                ((CommandPoolWrapper *)local_68,this->m_LogicalDevice,&local_48,"");
      VulkanUtilities::
      VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::operator=
                (__return_storage_ptr__,
                 (VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> *)
                 local_68);
      VulkanUtilities::
      VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0>::
      ~VulkanObjectWrapper
                ((VulkanObjectWrapper<VkCommandPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)0> *)
                 local_68);
      if (__return_storage_ptr__->m_VkObject == (VkCommandPool_T *)0x0) {
        FormatString<char[37]>
                  ((string *)local_68,(char (*) [37])"Failed to create Vulkan command pool");
        DebugAssertionFailed
                  ((Char *)local_68._0_8_,"AllocateCommandPool",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandPoolManager.cpp"
                   ,0x46);
        if ((element_type *)local_68._0_8_ != (element_type *)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
        }
      }
    }
    VulkanUtilities::SetCommandPoolName
              (this->m_LogicalDevice->m_VkDevice,__return_storage_ptr__->m_VkObject,DebugName);
    LOCK();
    (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i =
         (this->m_AllocatedPoolCounter).super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

VulkanUtilities::CommandPoolWrapper CommandPoolManager::AllocateCommandPool(const char* DebugName)
{
    std::lock_guard<std::mutex> LockGuard{m_Mutex};

    VulkanUtilities::CommandPoolWrapper CmdPool;
    if (!m_CmdPools.empty())
    {
        CmdPool = std::move(m_CmdPools.front());
        m_CmdPools.pop_front();

        m_LogicalDevice.ResetCommandPool(CmdPool);
    }

    if (CmdPool == VK_NULL_HANDLE)
    {
        VkCommandPoolCreateInfo CmdPoolCI = {};

        CmdPoolCI.sType            = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
        CmdPoolCI.pNext            = nullptr;
        CmdPoolCI.queueFamilyIndex = m_QueueFamilyIndex;
        CmdPoolCI.flags            = m_CmdPoolFlags;

        CmdPool = m_LogicalDevice.CreateCommandPool(CmdPoolCI);
        DEV_CHECK_ERR(CmdPool != VK_NULL_HANDLE, "Failed to create Vulkan command pool");
    }

    VulkanUtilities::SetCommandPoolName(m_LogicalDevice.GetVkDevice(), CmdPool, DebugName);

#ifdef DILIGENT_DEVELOPMENT
    ++m_AllocatedPoolCounter;
#endif
    return CmdPool;
}